

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

Flag<TestConfig> *
anon_unknown.dwarf_4a080::CredentialFlagWithDefault
          (Flag<TestConfig> *__return_storage_ptr__,Flag<TestConfig> *default_flag,
          Flag<CredentialConfig> *flag)

{
  bool bVar1;
  undefined2 uVar2;
  char *pcVar3;
  int iVar4;
  undefined8 *puVar5;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  char *local_50;
  undefined2 local_48;
  _Any_data local_40;
  code *local_30;
  undefined8 uStack_28;
  
  pcVar3 = flag->name;
  iVar4 = strcmp(default_flag->name,pcVar3);
  if ((iVar4 == 0) && (bVar1 = flag->has_param, default_flag->has_param == bVar1)) {
    __return_storage_ptr__->name = pcVar3;
    __return_storage_ptr__->has_param = bVar1;
    __return_storage_ptr__->skip_handshaker = false;
    uVar2 = *(undefined2 *)&default_flag->has_param;
    pcVar3 = default_flag->name;
    std::function<bool_(TestConfig_*,_const_char_*)>::function
              ((function<bool_(TestConfig_*,_const_char_*)> *)&local_70,&default_flag->set_param);
    local_48._0_1_ = flag->has_param;
    local_48._1_1_ = flag->skip_handshaker;
    local_50 = flag->name;
    std::function<bool_(CredentialConfig_*,_const_char_*)>::function
              ((function<bool_(CredentialConfig_*,_const_char_*)> *)&local_40,&flag->set_param);
    (__return_storage_ptr__->set_param).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->set_param)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->set_param).super__Function_base._M_functor + 8)
         = 0;
    puVar5 = (undefined8 *)operator_new(0x60);
    *(undefined2 *)(puVar5 + 1) = uVar2;
    *puVar5 = pcVar3;
    puVar5[2] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    puVar5[5] = uStack_58;
    if (local_60 != (code *)0x0) {
      puVar5[2] = local_70._M_unused._M_object;
      puVar5[3] = local_70._8_8_;
      puVar5[4] = local_60;
      local_60 = (code *)0x0;
      uStack_58 = 0;
    }
    *(undefined2 *)(puVar5 + 7) = local_48;
    puVar5[6] = local_50;
    puVar5[8] = 0;
    puVar5[9] = 0;
    puVar5[10] = 0;
    puVar5[0xb] = uStack_28;
    if (local_30 != (code *)0x0) {
      puVar5[8] = local_40._M_unused._M_object;
      puVar5[9] = local_40._8_8_;
      puVar5[10] = local_30;
      local_30 = (code *)0x0;
      uStack_28 = 0;
    }
    *(undefined8 **)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = puVar5;
    (__return_storage_ptr__->set_param)._M_invoker =
         std::
         _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:278:27)>
         ::_M_invoke;
    (__return_storage_ptr__->set_param).super__Function_base._M_manager =
         std::
         _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:278:27)>
         ::_M_manager;
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Flag<TestConfig> CredentialFlagWithDefault(Flag<TestConfig> default_flag,
                                           Flag<CredentialConfig> flag) {
  BSSL_CHECK(strcmp(default_flag.name, flag.name) == 0);
  BSSL_CHECK(default_flag.has_param == flag.has_param);
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              return default_flag.set_param(config, param);
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}